

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void cilk_fiber_tbb_interop_use_saved_stack_op_info(cilk_fiber *fiber)

{
  __cilk_tbb_stack_op_thunk o;
  __cilk_tbb_stack_op_thunk *p_Var1;
  long in_RDI;
  __cilk_tbb_stack_op_thunk *saved_thunk;
  
  p_Var1 = __cilkrts_get_tls_tbb_interop();
  if (in_RDI == 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                  ,0x20d,"fiber");
  }
  if (p_Var1 != (__cilk_tbb_stack_op_thunk *)0x0) {
    o.data = p_Var1;
    o.routine = (__cilk_tbb_pfn_stack_op)p_Var1->data;
    cilk_fiber_set_stack_op((cilk_fiber *)p_Var1->routine,o);
    cilk_fiber_tbb_interop_free_stack_op_info();
  }
  return;
}

Assistant:

void cilk_fiber_tbb_interop_use_saved_stack_op_info(cilk_fiber* fiber)
{
    __cilk_tbb_stack_op_thunk *saved_thunk =
        __cilkrts_get_tls_tbb_interop();

    CILK_ASSERT(fiber);
    // If we haven't allocated a TBB interop index, we don't have any saved info
    if (NULL == saved_thunk) {
        DBG_STACK_OPS ("cilk_fiber %p: tbb_interop_use_saved_stack_op_info - no saved info\n",
                       fiber);
        return;
    }

    DBG_STACK_OPS ("cilk_fiber %p: tbb_interop_use_saved_stack_op_info - using saved info\n",
                   fiber);

     // Associate the saved info with the __cilkrts_stack
    cilk_fiber_set_stack_op(fiber, *saved_thunk);
    
    // Free the saved data.  We'll save it again if needed when the code
    // returns from the initial function
    cilk_fiber_tbb_interop_free_stack_op_info();
}